

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.hpp
# Opt level: O1

void diy::mpi::Collectives<char,_void_*>::gather
               (communicator *comm,vector<char,_std::allocator<char>_> *in,int root)

{
  pointer pcVar1;
  pointer pcVar2;
  undefined4 in_EAX;
  int iVar3;
  
  pcVar1 = (in->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar2 = (in->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  iVar3 = (int)pcVar2 - (int)pcVar1;
  if (pcVar1 == pcVar2) {
    iVar3 = 0;
  }
  MPI_Gather(&stack0xffffffffffffffdc,1,&ompi_mpi_int,&stack0xffffffffffffffdc,1,&ompi_mpi_int,root,
             (comm->comm_).data,CONCAT44(iVar3,in_EAX));
  pcVar1 = (in->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar2 = (in->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  iVar3 = (int)pcVar2 - (int)pcVar1;
  if (pcVar1 == pcVar2) {
    iVar3 = 0;
  }
  MPI_Gatherv(pcVar1,iVar3,&ompi_mpi_byte,0,0,0,&ompi_mpi_byte,root,(comm->comm_).data);
  return;
}

Assistant:

static void gather(const communicator& comm, const std::vector<T>& in, int root)
    {
      Collectives<int,void*>::gather(comm, count(in), root);
      detail::gather_v(comm, address(in), count(in), datatype_of(in), 0, 0, 0, root);
    }